

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imagegenerator.cpp
# Opt level: O2

void __thiscall
stackjit::AssemblyImageGenerator::generateFunctionBody
          (AssemblyImageGenerator *this,BinaryData *data,Function *function)

{
  pointer pbVar1;
  pointer pIVar2;
  InstructionFormats IVar3;
  char value;
  AttributeContainer *attributes;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar4;
  vector<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_> *pvVar5;
  string *psVar6;
  Function *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param;
  pointer pbVar7;
  pointer this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local;
  long lVar8;
  OpCodes local_39;
  int local_38;
  float local_34;
  
  this_00 = function;
  attributes = Loader::Function::attributes_abi_cxx11_(function);
  generateAttributes((AssemblyImageGenerator *)this_00,data,attributes);
  pvVar4 = Loader::Function::localTypes_abi_cxx11_(function);
  anon_unknown_3::addData<unsigned_long>
            (data,(long)(pvVar4->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pvVar4->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 5);
  pvVar4 = Loader::Function::localTypes_abi_cxx11_(function);
  pbVar1 = (pvVar4->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar7 = (pvVar4->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pbVar7 != pbVar1; pbVar7 = pbVar7 + 1) {
    anon_unknown_3::addString(data,pbVar7);
  }
  pvVar5 = Loader::Function::instructions(function);
  anon_unknown_3::addData<unsigned_long>
            (data,((long)(pvVar5->
                         super__Vector_base<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>
                         )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pvVar5->
                        super__Vector_base<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>
                        )._M_impl.super__Vector_impl_data._M_start) / 0x68);
  pvVar5 = Loader::Function::instructions(function);
  pIVar2 = (pvVar5->
           super__Vector_base<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (this_01 = (pvVar5->
                 super__Vector_base<stackjit::Loader::Instruction,_std::allocator<stackjit::Loader::Instruction>_>
                 )._M_impl.super__Vector_impl_data._M_start; this_01 != pIVar2;
      this_01 = this_01 + 1) {
    IVar3 = Loader::Instruction::format(this_01);
    anon_unknown_3::addData<char>(data,IVar3);
    local_39 = Loader::Instruction::opCode(this_01);
    std::vector<char,_std::allocator<char>_>::push_back(data,(value_type *)&local_39);
    IVar3 = Loader::Instruction::format(this_01);
    switch(IVar3) {
    case IntData:
      local_38 = Loader::Instruction::intValue(this_01);
      for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
        std::vector<char,_std::allocator<char>_>::push_back
                  (data,(value_type *)((long)&local_38 + lVar8));
      }
      break;
    case FloatData:
      local_34 = Loader::Instruction::floatValue(this_01);
      for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
        std::vector<char,_std::allocator<char>_>::push_back
                  (data,(value_type *)((long)&local_34 + lVar8));
      }
      break;
    case CharData:
      value = Loader::Instruction::charValue(this_01);
      anon_unknown_3::addData<char>(data,value);
      break;
    case StringData:
    case StringConstantData:
      psVar6 = Loader::Instruction::stringValue_abi_cxx11_(this_01);
      anon_unknown_3::addString(data,psVar6);
      break;
    case Call:
      psVar6 = Loader::Instruction::stringValue_abi_cxx11_(this_01);
      anon_unknown_3::addString(data,psVar6);
      pvVar4 = Loader::Instruction::callParameters_abi_cxx11_(this_01);
      anon_unknown_3::addData<unsigned_long>
                (data,(long)(pvVar4->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(pvVar4->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 5);
      pvVar4 = Loader::Instruction::callParameters_abi_cxx11_(this_01);
      pbVar1 = (pvVar4->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar7 = (pvVar4->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start; pbVar7 != pbVar1;
          pbVar7 = pbVar7 + 1) {
        anon_unknown_3::addString(data,pbVar7);
      }
      break;
    case CallInstance:
      psVar6 = Loader::Instruction::stringValue_abi_cxx11_(this_01);
      anon_unknown_3::addString(data,psVar6);
      psVar6 = Loader::Instruction::calledClassType_abi_cxx11_(this_01);
      anon_unknown_3::addString(data,psVar6);
      pvVar4 = Loader::Instruction::callParameters_abi_cxx11_(this_01);
      anon_unknown_3::addData<unsigned_long>
                (data,(long)(pvVar4->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(pvVar4->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 5);
      pvVar4 = Loader::Instruction::callParameters_abi_cxx11_(this_01);
      pbVar1 = (pvVar4->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar7 = (pvVar4->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start; pbVar7 != pbVar1;
          pbVar7 = pbVar7 + 1) {
        anon_unknown_3::addString(data,pbVar7);
      }
    }
  }
  return;
}

Assistant:

void AssemblyImageGenerator::generateFunctionBody(BinaryData& data, Loader::Function& function) {
		//Attributes
		generateAttributes(data, function.attributes());

		//Locals
		addData<std::size_t>(data, function.localTypes().size());
		for (auto& local : function.localTypes()) {
			addString(data, local);
		}

		//Body
		addData<std::size_t>(data, function.instructions().size());

		for (auto& instruction : function.instructions()) {
			addData<char>(data, (char)instruction.format());
			addData<unsigned char>(data, (unsigned char)instruction.opCode());

			switch (instruction.format()) {
				case Loader::InstructionFormats::OpCodeOnly:
					break;
				case Loader::InstructionFormats::IntData:
					addData(data, instruction.intValue());
					break;
				case Loader::InstructionFormats::FloatData:
					addData(data, instruction.floatValue());
					break;
				case Loader::InstructionFormats::CharData:
					addData(data, instruction.charValue());
					break;
				case Loader::InstructionFormats::StringData:
					addString(data, instruction.stringValue());
					break;
				case Loader::InstructionFormats::StringConstantData:
					addString(data, instruction.stringValue());
					break;
				case Loader::InstructionFormats::Call:
					addString(data, instruction.stringValue());
					addData(data, instruction.callParameters().size());

					for (auto& param : instruction.callParameters()) {
						addString(data, param);
					}
					break;
				case Loader::InstructionFormats::CallInstance:
					addString(data, instruction.stringValue());
					addString(data, instruction.calledClassType());
					addData(data, instruction.callParameters().size());

					for (auto& parameter : instruction.callParameters()) {
						addString(data, parameter);
					}
					break;
			}
		}
	}